

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# order_book_perf_test.cc
# Opt level: O2

type test_remove(order_book *ob,unsigned_long count)

{
  long lVar1;
  long lVar2;
  unsigned_long i;
  char *__filename;
  
  lVar1 = std::chrono::_V2::system_clock::now();
  for (__filename = (char *)0x0; (char *)count != __filename; __filename = __filename + 1) {
    helix::order_book::remove(ob,__filename);
  }
  lVar2 = std::chrono::_V2::system_clock::now();
  return (type)(lVar2 - lVar1);
}

Assistant:

auto test_remove(order_book& ob, unsigned long count)
{
    auto start = clock_type::now();
    for (unsigned long i = 0; i < count; i++) {
        ob.remove(i);
    }
    auto end = clock_type::now();
    return end - start;
}